

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncomingMessage.cpp
# Opt level: O3

bool __thiscall DIS::IncomingMessage::AddPduBank(IncomingMessage *this,uchar id,IPduBank *pduBank)

{
  bool bVar1;
  value_type candidate;
  pair<const_unsigned_char,_DIS::IPduBank_*> local_28;
  iterator local_18;
  
  local_28.first = id;
  local_28.second = pduBank;
  bVar1 = FindPduBankContainer(this,id,pduBank,&local_18);
  if (!bVar1) {
    std::
    _Rb_tree<unsigned_char,std::pair<unsigned_char_const,DIS::IPduBank*>,std::_Select1st<std::pair<unsigned_char_const,DIS::IPduBank*>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,DIS::IPduBank*>>>
    ::_M_emplace_equal<std::pair<unsigned_char_const,DIS::IPduBank*>&>
              ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,DIS::IPduBank*>,std::_Select1st<std::pair<unsigned_char_const,DIS::IPduBank*>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,DIS::IPduBank*>>>
                *)&this->_pduBanks,&local_28);
  }
  return !bVar1;
}

Assistant:

bool IncomingMessage::AddPduBank(unsigned char id, IPduBank* pduBank)
{
   PduBankContainer::value_type candidate(id,pduBank);
   PduBankContainer::iterator containerIter;

   // If this id doesn't already have this PDU bank (it shouldn't)
   if (!FindPduBankContainer(id, pduBank, containerIter))
   {
       _pduBanks.insert( candidate );
       return true;
   }

   return false;    
}